

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_arg_helper::test_method(rpc_arg_helper *this)

{
  initializer_list<RPCArg> __l;
  string_view json;
  string_view json_00;
  long in_FS_OFFSET;
  RPCArg *in_stack_ffffffffffffeea8;
  UniValue *in_stack_ffffffffffffeeb0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffeeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeec0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffeec8;
  allocator_type *in_stack_ffffffffffffeee0;
  long *plVar1;
  UniValue *in_stack_ffffffffffffeee8;
  long *plVar2;
  iterator in_stack_ffffffffffffeef0;
  RPCArgOptions *in_stack_ffffffffffffeef8;
  RPCMethodImpl *test_impl;
  string *in_stack_ffffffffffffef00;
  UniValue *args;
  Fallback *in_stack_ffffffffffffef08;
  Fallback *fallback;
  undefined8 in_stack_ffffffffffffef10;
  Type TVar3;
  string *in_stack_ffffffffffffef18;
  string *name;
  RPCArg *in_stack_ffffffffffffef20;
  RPCArg *this_00;
  allocator<char> *paVar4;
  allocator<char> *paVar5;
  rpc_arg_helper *this_local;
  RPCMethodImpl check_positional;
  undefined1 local_fa6;
  undefined1 local_fa5 [8];
  undefined1 local_f9d [6];
  allocator<char> local_f97;
  allocator<char> local_f96;
  allocator<char> local_f95;
  allocator<char> local_f94;
  allocator<char> local_f93;
  allocator<char> local_f92;
  allocator<char> local_f91;
  undefined4 local_f90;
  allocator<char> local_f8a;
  allocator<char> local_f89 [8];
  allocator<char> local_f81;
  vector<RPCArg,_std::allocator<RPCArg>_> params;
  uint64_t DEFAULT_UINT64_T;
  char *DEFAULT_STRING;
  bool DEFAULT_BOOL;
  long local_740 [165];
  RPCArg local_218;
  Fallback local_110 [2];
  long local_8;
  
  TVar3 = (Type)((ulong)in_stack_ffffffffffffef10 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  paVar5 = &local_f81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  local_f89[1] = (allocator<char>)0x0;
  local_f89[2] = (allocator<char>)0x0;
  local_f89[3] = (allocator<char>)0x0;
  local_f89[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,&in_stack_ffffffffffffeeb0->typ);
  paVar4 = local_f89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,TVar3,in_stack_ffffffffffffef08
                 ,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  local_f90 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,&in_stack_ffffffffffffeeb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,TVar3,in_stack_ffffffffffffef08
                 ,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
            (in_stack_ffffffffffffeee8,(unsigned_long *)in_stack_ffffffffffffeee0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,TVar3,in_stack_ffffffffffffef08
                 ,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  UniValue::UniValue<const_char_*const_&,_const_char_*,_true>
            ((UniValue *)in_stack_ffffffffffffeef0,(char **)in_stack_ffffffffffffeee8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,TVar3,in_stack_ffffffffffffef08
                 ,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  UniValue::UniValue<const_bool_&,_bool,_true>
            (in_stack_ffffffffffffeee8,(bool *)in_stack_ffffffffffffeee0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,TVar3,in_stack_ffffffffffffef08
                 ,in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
  this_00 = &local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  local_f9d._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,&in_stack_ffffffffffffeeb0->typ);
  name = (string *)local_f9d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(this_00,name,TVar3,in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                 in_stack_ffffffffffffeef8);
  fallback = local_110;
  TVar3 = (Type)((ulong)(local_fa5 + 7) >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  local_fa5._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeeb8,&in_stack_ffffffffffffeeb0->typ);
  args = (UniValue *)local_fa5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeef8,(char *)in_stack_ffffffffffffeef0,
             (allocator<char> *)in_stack_ffffffffffffeee8);
  std::__cxx11::string::string(in_stack_ffffffffffffeec0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeea8);
  RPCArg::RPCArg(this_00,name,TVar3,fallback,(string *)args,in_stack_ffffffffffffeef8);
  test_impl = (RPCMethodImpl *)&local_fa6;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffeea8);
  __l._M_len = (size_type)test_impl;
  __l._M_array = in_stack_ffffffffffffeef0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeee8,__l,
             in_stack_ffffffffffffeee0);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)in_stack_ffffffffffffeea8);
  plVar2 = local_740;
  plVar1 = &local_8;
  do {
    plVar1 = plVar1 + -0x21;
    RPCArg::~RPCArg(in_stack_ffffffffffffeea8);
  } while (plVar1 != plVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_fa5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_fa5 + 7));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_f9d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_f9d + 5));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f97);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f96);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f95);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f94);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f93);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f92);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f91);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f8a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(local_f89);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeea8);
  std::__cxx11::string::~string(&in_stack_ffffffffffffeea8->m_names);
  std::allocator<char>::~allocator(&local_f81);
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<rpc_tests::rpc_arg_helper::test_method()::__0,void>
            (in_stack_ffffffffffffeeb8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffeeb0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffeec8,
             (char *)in_stack_ffffffffffffeec0);
  json._M_str = (char *)paVar5;
  json._M_len = (size_t)paVar4;
  JSON(json);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            (in_stack_ffffffffffffeec8,
             (function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeec0);
  CheckRpc((vector<RPCArg,_std::allocator<RPCArg>_> *)fallback,args,test_impl);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeea8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffeea8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffeec8,
             (char *)in_stack_ffffffffffffeec0);
  json_00._M_str = (char *)paVar5;
  json_00._M_len = (size_t)paVar4;
  JSON(json_00);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            (in_stack_ffffffffffffeec8,
             (function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeec0);
  CheckRpc((vector<RPCArg,_std::allocator<RPCArg>_> *)fallback,args,test_impl);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeea8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffeea8);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffeea8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_arg_helper)
{
    constexpr bool DEFAULT_BOOL = true;
    constexpr auto DEFAULT_STRING = "default";
    constexpr uint64_t DEFAULT_UINT64_T = 3;

    //! Parameters with which the RPCHelpMan is instantiated
    const std::vector<RPCArg> params{
        // Required arg
        {"req_int", RPCArg::Type::NUM, RPCArg::Optional::NO, ""},
        {"req_str", RPCArg::Type::STR, RPCArg::Optional::NO, ""},
        // Default arg
        {"def_uint64_t", RPCArg::Type::NUM, RPCArg::Default{DEFAULT_UINT64_T}, ""},
        {"def_string", RPCArg::Type::STR, RPCArg::Default{DEFAULT_STRING}, ""},
        {"def_bool", RPCArg::Type::BOOL, RPCArg::Default{DEFAULT_BOOL}, ""},
        // Optional arg without default
        {"opt_double", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, ""},
        {"opt_string", RPCArg::Type::STR, RPCArg::Optional::OMITTED, ""}
    };

    //! Check that `self.Arg` returns the same value as the `request.params` accessors
    RPCHelpMan::RPCMethodImpl check_positional = [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            BOOST_CHECK_EQUAL(self.Arg<int>("req_int"), request.params[0].getInt<int>());
            BOOST_CHECK_EQUAL(self.Arg<std::string>("req_str"), request.params[1].get_str());
            BOOST_CHECK_EQUAL(self.Arg<uint64_t>("def_uint64_t"), request.params[2].isNull() ? DEFAULT_UINT64_T : request.params[2].getInt<uint64_t>());
            BOOST_CHECK_EQUAL(self.Arg<std::string>("def_string"), request.params[3].isNull() ? DEFAULT_STRING : request.params[3].get_str());
            BOOST_CHECK_EQUAL(self.Arg<bool>("def_bool"), request.params[4].isNull() ? DEFAULT_BOOL : request.params[4].get_bool());
            if (!request.params[5].isNull()) {
                BOOST_CHECK_EQUAL(self.MaybeArg<double>("opt_double").value(), request.params[5].get_real());
            } else {
                BOOST_CHECK(!self.MaybeArg<double>("opt_double"));
            }
            if (!request.params[6].isNull()) {
                BOOST_CHECK(self.MaybeArg<std::string>("opt_string"));
                BOOST_CHECK_EQUAL(*self.MaybeArg<std::string>("opt_string"), request.params[6].get_str());
            } else {
                BOOST_CHECK(!self.MaybeArg<std::string>("opt_string"));
            }
            return UniValue{};
        };
    CheckRpc(params, UniValue{JSON(R"([5, "hello", null, null, null, null, null])")}, check_positional);
    CheckRpc(params, UniValue{JSON(R"([5, "hello", 4, "test", true, 1.23, "world"])")}, check_positional);
}